

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedgraph.h
# Opt level: O2

bool __thiscall libDAI::UEdge::operator<(UEdge *this,UEdge *x)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = this->n1;
  uVar4 = this->n2;
  uVar2 = x->n1;
  uVar5 = x->n2;
  bVar3 = true;
  uVar6 = uVar4;
  if (uVar1 < uVar4) {
    uVar6 = uVar1;
  }
  uVar7 = uVar5;
  if (uVar2 < uVar5) {
    uVar7 = uVar2;
  }
  if (uVar7 <= uVar6) {
    if (uVar5 < uVar2) {
      uVar5 = uVar2;
    }
    if (uVar4 < uVar1) {
      uVar4 = uVar1;
    }
    bVar3 = uVar4 < uVar5 && uVar6 == uVar7;
  }
  return bVar3;
}

Assistant:

bool operator<( const UEdge &x ) const {
                size_t s = n1, l = n2;
                if( s > l )
                    std::swap( s, l );
                size_t xs = x.n1, xl = x.n2;
                if( xs > xl )
                    std::swap( xs, xl );
                return( (s < xs) || ((s == xs) && (l < xl)) );
            }